

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.h
# Opt level: O0

void __thiscall
oout::NamedTest::NamedTest<oout::NamedTest>
          (NamedTest *this,string *name,shared_ptr<const_oout::Test> *test1,
          shared_ptr<const_oout::Test> *test2,shared_ptr<oout::NamedTest> *tests)

{
  shared_ptr<const_oout::SuiteTest> local_50;
  shared_ptr<const_oout::Test> local_40;
  shared_ptr<oout::NamedTest> *local_30;
  shared_ptr<oout::NamedTest> *tests_local;
  shared_ptr<const_oout::Test> *test2_local;
  shared_ptr<const_oout::Test> *test1_local;
  string *name_local;
  NamedTest *this_local;
  
  local_30 = tests;
  tests_local = (shared_ptr<oout::NamedTest> *)test2;
  test2_local = test1;
  test1_local = (shared_ptr<const_oout::Test> *)name;
  name_local = (string *)this;
  std::
  make_shared<oout::SuiteTest_const,std::shared_ptr<oout::Test_const>const&,std::shared_ptr<oout::Test_const>const&,std::shared_ptr<oout::NamedTest>const&>
            ((shared_ptr<const_oout::Test> *)&local_50,test1,(shared_ptr<oout::NamedTest> *)test2);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::SuiteTest_const,void>
            ((shared_ptr<oout::Test_const> *)&local_40,&local_50);
  NamedTest(this,name,&local_40);
  std::shared_ptr<const_oout::Test>::~shared_ptr(&local_40);
  std::shared_ptr<const_oout::SuiteTest>::~shared_ptr(&local_50);
  return;
}

Assistant:

NamedTest(
		const std::string &name,
		const std::shared_ptr<const Test> &test1,
		const std::shared_ptr<const Test> &test2,
		const std::shared_ptr<T> & ... tests
	) : NamedTest(name, std::make_shared<const SuiteTest>(test1, test2, tests...))
	{
	}